

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacking.hpp
# Opt level: O2

string * __thiscall
slack::_detail::join<std::__cxx11::string>
          (string *__return_storage_ptr__,_detail *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *vec,string *sep)

{
  ostream *poVar1;
  long lVar2;
  size_t i;
  ulong uVar3;
  allocator local_1b9;
  stringstream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  if (*(string **)(this + 8) == *(string **)this) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_1b9);
  }
  else {
    std::operator<<(local_1a8,*(string **)this);
    lVar2 = 0x20;
    for (uVar3 = 1; uVar3 < (ulong)(*(long *)(this + 8) - *(long *)this >> 5); uVar3 = uVar3 + 1) {
      poVar1 = std::operator<<(local_1a8,(string *)vec);
      std::operator<<(poVar1,(string *)(*(long *)this + lVar2));
      lVar2 = lVar2 + 0x20;
    }
    std::__cxx11::stringbuf::str();
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

inline
std::string join(const std::vector<T>& vec, const std::string& sep) {
    std::stringstream ss;
    if (vec.size() == 0) { return ""; };
    ss << vec[0];
    for (size_t i = 1; i < vec.size(); i ++) { ss << sep << vec[i]; }
    return ss.str();
}